

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnceReduction.cpp
# Opt level: O0

Pass * wasm::createOnceReductionPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x30);
  memset(this,0,0x30);
  OnceReduction::OnceReduction((OnceReduction *)this);
  return this;
}

Assistant:

Pass* createOnceReductionPass() { return new OnceReduction(); }